

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

char * fs_event_get_filename(int i)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-",(ulong)(uint)i);
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static const char* fs_event_get_filename(int i) {
  snprintf(fs_event_filename,
           sizeof(fs_event_filename),
           "watch_dir/%s%d",
           file_prefix,
           i);
  return fs_event_filename;
}